

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O0

void __thiscall
FIX::SocketInitiator::onDisconnect(SocketInitiator *this,SocketConnector *param_1,socket_handle s)

{
  bool bVar1;
  pointer ppVar2;
  Session *pSVar3;
  SessionID *pSVar4;
  Session *pSession;
  _Self local_40;
  SocketConnection *local_38;
  SocketConnection *pSocketConnection;
  iterator j;
  iterator i;
  socket_handle s_local;
  SocketConnector *param_1_local;
  SocketInitiator *this_local;
  
  i._M_node._4_4_ = s;
  j = std::
      map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
      ::find(&this->m_connections,(key_type *)((long)&i._M_node + 4));
  pSocketConnection =
       (SocketConnection *)
       std::
       map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
       ::find(&this->m_pendingConnections,(key_type *)((long)&i._M_node + 4));
  local_38 = (SocketConnection *)0x0;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
       ::end(&this->m_connections);
  bVar1 = std::operator!=(&j,&local_40);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::operator->(&j);
    local_38 = ppVar2->second;
  }
  pSession = (Session *)
             std::
             map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
             ::end(&this->m_pendingConnections);
  bVar1 = std::operator!=((_Self *)&pSocketConnection,(_Self *)&pSession);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_> *)
                        &pSocketConnection);
    local_38 = ppVar2->second;
  }
  if (local_38 != (SocketConnection *)0x0) {
    pSVar3 = SocketConnection::getSession(local_38);
    pSVar4 = Session::getSessionID(pSVar3);
    Initiator::setDisconnected(&this->super_Initiator,pSVar4);
    pSVar3 = SocketConnection::getSession(local_38);
    if (pSVar3 != (Session *)0x0) {
      Session::disconnect(pSVar3);
      pSVar4 = Session::getSessionID(pSVar3);
      Initiator::setDisconnected(&this->super_Initiator,pSVar4);
    }
    if (local_38 != (SocketConnection *)0x0) {
      (*(local_38->super_Responder)._vptr_Responder[1])();
    }
    std::
    map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
    ::erase(&this->m_connections,(key_type *)((long)&i._M_node + 4));
    std::
    map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
    ::erase(&this->m_pendingConnections,(key_type *)((long)&i._M_node + 4));
  }
  return;
}

Assistant:

void SocketInitiator::onDisconnect(SocketConnector &, socket_handle s) {
  SocketConnections::iterator i = m_connections.find(s);
  SocketConnections::iterator j = m_pendingConnections.find(s);

  SocketConnection *pSocketConnection = 0;
  if (i != m_connections.end()) {
    pSocketConnection = i->second;
  }
  if (j != m_pendingConnections.end()) {
    pSocketConnection = j->second;
  }
  if (!pSocketConnection) {
    return;
  }

  setDisconnected(pSocketConnection->getSession()->getSessionID());

  Session *pSession = pSocketConnection->getSession();
  if (pSession) {
    pSession->disconnect();
    setDisconnected(pSession->getSessionID());
  }

  delete pSocketConnection;
  m_connections.erase(s);
  m_pendingConnections.erase(s);
}